

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  FILE *pFVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  int *piVar9;
  char *pcVar10;
  char *pcVar11;
  char cVar12;
  char *local_1058;
  char *pcStack_1050;
  telnet_t *local_1048;
  FILE *local_1040;
  char buffer [4096];
  
  local_1058 = (char *)0x0;
  pcStack_1050 = (char *)0x0;
  if (argc == 3) {
    pFVar4 = fopen(argv[2],"rt");
    pFVar2 = _stderr;
    if (pFVar4 == (FILE *)0x0) {
      pcVar6 = argv[2];
      piVar9 = __errno_location();
      pcVar5 = strerror(*piVar9);
      fprintf(pFVar2,"Failed to open %s: %s\n",pcVar6,pcVar5);
      iVar3 = 2;
    }
    else {
      pcVar6 = (char *)0x0;
      while (pcVar5 = fgets(buffer,0x1000,pFVar4), pcVar5 != (char *)0x0) {
        pcVar6 = append(pcVar6,buffer);
        local_1058 = pcVar6;
      }
      fclose(pFVar4);
      pFVar4 = fopen(argv[1],"rt");
      pFVar2 = _stderr;
      if (pFVar4 == (FILE *)0x0) {
        pcVar6 = argv[1];
        piVar9 = __errno_location();
        pcVar5 = strerror(*piVar9);
        fprintf(pFVar2,"Failed to open %s: %s\n",pcVar6,pcVar5);
        iVar3 = 3;
      }
      else {
        local_1048 = telnet_init(telopts,event_print,'\0',&local_1058);
        pFVar2 = _stderr;
        local_1040 = pFVar4;
        if (local_1048 == (telnet_t *)0x0) {
          piVar9 = __errno_location();
          pcVar6 = strerror(*piVar9);
          fprintf(pFVar2,"Failed to initialize libtelnet: %s\n",pcVar6);
          fclose(pFVar4);
          iVar3 = 4;
        }
        else {
          while ((pcVar6 = fgets(buffer,0x1000,pFVar4), pcVar6 != (char *)0x0 &&
                 (buffer._0_4_ != 0xa2525))) {
            if ((char)buffer._0_4_ != '#') {
              sVar7 = strlen(buffer);
              pcVar11 = buffer + sVar7;
              pcVar5 = buffer;
              for (pcVar6 = buffer; pcVar6 != pcVar11; pcVar6 = pcVar6 + 1) {
                cVar12 = *pcVar6;
                if ((long)cVar12 == 0x25) {
                  pcVar10 = pcVar6 + 1;
                  if (pcVar10 == pcVar11) break;
                  cVar1 = *pcVar10;
                  cVar12 = '%';
                  if ((long)cVar1 != 0x25) {
                    pcVar10 = pcVar6 + 2;
                    if (pcVar10 == pcVar11) break;
                    ppuVar8 = __ctype_b_loc();
                    cVar12 = -0x30;
                    if ((*(byte *)((long)*ppuVar8 + (long)*pcVar10 * 2 + 1) & 8) == 0) {
                      cVar12 = -0x37;
                    }
                    cVar12 = cVar12 + *pcVar10 +
                             (((*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 8) == 0) * '\t' +
                             cVar1) * '\x10';
                  }
LAB_001013e1:
                  *pcVar5 = cVar12;
                  pcVar5 = pcVar5 + 1;
                  pcVar6 = pcVar10;
                }
                else {
                  ppuVar8 = __ctype_b_loc();
                  pcVar10 = pcVar6;
                  if ((*(byte *)((long)*ppuVar8 + (long)cVar12 * 2 + 1) & 0x40) != 0)
                  goto LAB_001013e1;
                }
              }
              *pcVar5 = '\0';
              telnet_recv(local_1048,buffer,(long)pcVar5 - (long)buffer);
              pFVar4 = local_1040;
            }
          }
          fclose(pFVar4);
          pcVar5 = pcStack_1050;
          pcVar6 = local_1058;
          iVar3 = strcmp(pcStack_1050,local_1058);
          if (iVar3 == 0) {
            telnet_free(local_1048);
            free(local_1058);
            free(pcStack_1050);
            iVar3 = 0;
          }
          else {
            fprintf(_stderr,"Expected:\n%s\n\nActual:\n%s\n",pcVar6,pcVar5);
            iVar3 = 5;
          }
        }
      }
    }
  }
  else {
    fwrite("Usage: telnet-test [test file] [expected outline]\n",0x32,1,_stderr);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
	FILE *fh;
	telnet_t *telnet;
	char buffer[4096];
	size_t len;
	state_t state;

	state.expected = NULL;
	state.actual = NULL;

	/* check for a requested input file */
	if (argc != 3) {
		fprintf(stderr, "Usage: telnet-test [test file] [expected outline]\n");
		return 1;
	}

	/* load expected input file */
	if ((fh = fopen(argv[2], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[2], strerror(errno));
		return 2;
	}

	while (fgets(buffer, sizeof(buffer), fh) != NULL) {
		state.expected = append(state.expected, buffer);
	}

	fclose(fh);

	/* open input file file */
	if ((fh = fopen(argv[1], "rt")) == NULL) {
		fprintf(stderr, "Failed to open %s: %s\n",
				argv[1], strerror(errno));
		return 3;
	}

	/* create telnet parser instance */
	if ((telnet = telnet_init(telopts, event_print, 0,
			&state)) == 0) {
		fprintf(stderr, "Failed to initialize libtelnet: %s\n",
				strerror(errno));
		fclose(fh);
		return 4;
	}

	/* read input until we hit EOF or marker */
	while (fgets(buffer, sizeof(buffer), fh) != NULL && strcmp(buffer, "%%\n") != 0) {
		if (buffer[0] != '#') {
			len = strlen(buffer);
			decode(buffer, &len);
			telnet_recv(telnet, buffer, len);
		}
	}

	fclose(fh);

	/* compare expected and actual output */
	if (strcmp(state.actual, state.expected) != 0) {
		fprintf(stderr, "Expected:\n%s\n\nActual:\n%s\n", state.expected, state.actual);
		return 5;
	}

	/* clean up */
	telnet_free(telnet);
	free(state.expected);
	free(state.actual);

	return 0;
}